

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  bool bVar1;
  FieldType FVar2;
  int iVar3;
  const_reference plVar4;
  const_reference puVar5;
  ulong *puVar6;
  const_reference puVar7;
  const_reference piVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar9;
  undefined4 extraout_var;
  ulong uVar10;
  size_t sVar11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  RepeatedPtrFieldBase *pRVar17;
  int iVar18;
  LogMessageFatal aLStack_38 [16];
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 2) == 0) {
      iVar18 = 0x1f;
      if ((number | 1U) != 0) {
        for (; (number | 1U) >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      if ((this->field_0xa & 4) == 0) {
        lVar13 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar13 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar14 = (uint)lVar13 | 1;
      iVar3 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar16 = (ulong)(iVar18 * 9 + 0x49U >> 6) + 4 + lVar13 + (ulong)(iVar3 * 9 + 0x49U >> 6);
    }
    else {
      sVar16 = 0;
    }
    return sVar16;
  }
  if (this->is_repeated != true) {
    if ((this->field_0xa & 2) != 0) {
      return 0;
    }
    FVar2 = anon_unknown_58::real_type(this->type);
    sVar16 = WireFormatLite::TagSize(number,FVar2);
    FVar2 = anon_unknown_58::real_type(this->type);
    switch(FVar2) {
    case TYPE_DOUBLE:
    case TYPE_FIXED64:
    case TYPE_SFIXED64:
      return sVar16 + 8;
    case TYPE_FLOAT:
    case TYPE_FIXED32:
    case TYPE_SFIXED32:
      return sVar16 + 4;
    case TYPE_INT64:
    case TYPE_UINT64:
      uVar10 = (this->field_0).uint64_t_value;
      goto LAB_001342d7;
    case TYPE_INT32:
    case TYPE_ENUM:
      uVar10 = (ulong)(this->field_0).int32_t_value;
LAB_001342d7:
      lVar13 = 0x3f;
      if ((uVar10 | 1) != 0) {
        for (; (uVar10 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      iVar18 = (int)lVar13;
LAB_001342df:
      uVar10 = (ulong)(iVar18 * 9 + 0x49U >> 6);
      break;
    case TYPE_BOOL:
      return sVar16 + 1;
    case TYPE_STRING:
      uVar10 = WireFormatLite::StringSize((string *)this->field_0);
      break;
    case TYPE_GROUP:
      uVar10 = (**(code **)(*(long *)this->field_0 + 0x18))();
      break;
    case TYPE_MESSAGE:
      if ((this->field_0xa & 4) == 0) {
        lVar13 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar13 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar14 = (uint)lVar13 | 1;
      iVar18 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      return sVar16 + lVar13 + (ulong)(iVar18 * 9 + 0x49U >> 6);
    case TYPE_BYTES:
      uVar10 = WireFormatLite::BytesSize((string *)this->field_0);
      break;
    case TYPE_UINT32:
      uVar14 = (this->field_0).uint32_t_value | 1;
      iVar18 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      goto LAB_001342df;
    case TYPE_SINT32:
      uVar10 = WireFormatLite::SInt32Size((this->field_0).int32_t_value);
      break;
    case MAX_FIELD_TYPE:
      uVar10 = WireFormatLite::SInt64Size((this->field_0).int64_t_value);
      break;
    default:
      return sVar16;
    }
    goto LAB_001344f7;
  }
  bVar1 = this->is_packed;
  FVar2 = anon_unknown_58::real_type(this->type);
  if (bVar1 == true) {
    switch(FVar2) {
    case TYPE_DOUBLE:
      uVar14 = RepeatedField<double>::size((RepeatedField<double> *)this->field_0);
      goto LAB_00134484;
    case TYPE_FLOAT:
      uVar14 = RepeatedField<float>::size((RepeatedField<float> *)this->field_0);
      goto LAB_001344c0;
    case TYPE_INT64:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        puVar6 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
        lVar13 = 0x3f;
        if ((*puVar6 | 1) != 0) {
          for (; (*puVar6 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar13 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_UINT64:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<unsigned_long>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,iVar18);
        lVar13 = 0x3f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar13 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_INT32:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
        lVar13 = 0x3f;
        if (((long)*piVar8 | 1U) != 0) {
          for (; ((long)*piVar8 | 1U) >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar13 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_FIXED64:
      uVar14 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)this->field_0);
      goto LAB_00134484;
    case TYPE_FIXED32:
      uVar14 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)this->field_0);
      goto LAB_001344c0;
    case TYPE_BOOL:
      uVar14 = RepeatedField<bool>::size((RepeatedField<bool> *)this->field_0);
      uVar15 = (ulong)uVar14;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (aLStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x592);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                ((LogMessage *)aLStack_38,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_38);
    case TYPE_UINT32:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<unsigned_int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        puVar5 = RepeatedField<unsigned_int>::Get
                           ((RepeatedField<unsigned_int> *)this->field_0,iVar18);
        iVar3 = 0x1f;
        if ((*puVar5 | 1) != 0) {
          for (; (*puVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar15 = uVar15 + (iVar3 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_ENUM:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
        lVar13 = 0x3f;
        if (((long)*piVar8 | 1U) != 0) {
          for (; ((long)*piVar8 | 1U) >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar13 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_SFIXED32:
      uVar14 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
LAB_001344c0:
      uVar15 = (ulong)uVar14 << 2;
      break;
    case TYPE_SFIXED64:
      uVar14 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
LAB_00134484:
      uVar15 = (ulong)uVar14 << 3;
      break;
    case TYPE_SINT32:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
        sVar16 = WireFormatLite::SInt32Size(*piVar8);
        uVar15 = uVar15 + sVar16;
      }
      break;
    case MAX_FIELD_TYPE:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        plVar4 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
        sVar16 = WireFormatLite::SInt64Size(*plVar4);
        uVar15 = uVar15 + sVar16;
      }
      break;
    default:
      *(undefined4 *)(this->cached_size).int_ = 0;
      return 0;
    }
    *(uint *)(this->cached_size).int_ = (uint)uVar15;
    if (uVar15 == 0) {
switchD_00134278_default:
      return 0;
    }
    uVar14 = (uint)uVar15 | 1;
    iVar18 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    uVar10 = (ulong)(iVar18 * 9 + 0x49U >> 6);
    uVar14 = number * 8 + 3;
    iVar18 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    sVar16 = uVar15 + (iVar18 * 9 + 0x49U >> 6);
LAB_001344f7:
    return sVar16 + uVar10;
  }
  sVar16 = WireFormatLite::TagSize(number,FVar2);
  FVar2 = anon_unknown_58::real_type(this->type);
  switch(FVar2) {
  case TYPE_DOUBLE:
    lVar13 = sVar16 + 8;
    uVar14 = RepeatedField<double>::size((RepeatedField<double> *)this->field_0);
    goto LAB_001347ef;
  case TYPE_FLOAT:
    lVar13 = sVar16 + 4;
    uVar14 = RepeatedField<float>::size((RepeatedField<float> *)this->field_0);
    goto LAB_001347ef;
  case TYPE_INT64:
    uVar14 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      puVar6 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
      lVar13 = 0x3f;
      if ((*puVar6 | 1) != 0) {
        for (; (*puVar6 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar16 = sVar16 + ((int)lVar13 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_UINT64:
    uVar14 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<unsigned_long>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      puVar7 = RepeatedField<unsigned_long>::Get
                         ((RepeatedField<unsigned_long> *)this->field_0,iVar18);
      lVar13 = 0x3f;
      if ((*puVar7 | 1) != 0) {
        for (; (*puVar7 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar16 = sVar16 + ((int)lVar13 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_INT32:
    uVar14 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
      lVar13 = 0x3f;
      if (((long)*piVar8 | 1U) != 0) {
        for (; ((long)*piVar8 | 1U) >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar16 = sVar16 + ((int)lVar13 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_FIXED64:
    lVar13 = sVar16 + 8;
    uVar14 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)this->field_0);
    goto LAB_001347ef;
  case TYPE_FIXED32:
    lVar13 = sVar16 + 4;
    uVar14 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)this->field_0);
    goto LAB_001347ef;
  case TYPE_BOOL:
    lVar13 = sVar16 + 1;
    uVar14 = RepeatedField<bool>::size((RepeatedField<bool> *)this->field_0);
    goto LAB_001347ef;
  case TYPE_STRING:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar10 = (ulong)(uint)pRVar17->current_size_;
    sVar16 = sVar16 * uVar10;
    for (iVar18 = 0; iVar18 < (int)uVar10; iVar18 = iVar18 + 1) {
      pVVar9 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (pRVar17,iVar18);
      sVar11 = WireFormatLite::StringSize(pVVar9);
      sVar16 = sVar16 + sVar11;
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar10 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_GROUP:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar10 = (ulong)(uint)pRVar17->current_size_;
    sVar16 = sVar16 * uVar10;
    for (iVar18 = 0; iVar18 < (int)uVar10; iVar18 = iVar18 + 1) {
      pVVar12 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                          (pRVar17,iVar18);
      iVar3 = (*pVVar12->_vptr_MessageLite[3])(pVVar12);
      sVar16 = sVar16 + CONCAT44(extraout_var,iVar3);
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar10 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_MESSAGE:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar10 = (ulong)(uint)pRVar17->current_size_;
    sVar16 = sVar16 * uVar10;
    for (iVar18 = 0; iVar18 < (int)uVar10; iVar18 = iVar18 + 1) {
      pVVar12 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                          (pRVar17,iVar18);
      sVar11 = WireFormatLite::MessageSize<google::protobuf::MessageLite>(pVVar12);
      sVar16 = sVar16 + sVar11;
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar10 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_BYTES:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar10 = (ulong)(uint)pRVar17->current_size_;
    sVar16 = sVar16 * uVar10;
    for (iVar18 = 0; iVar18 < (int)uVar10; iVar18 = iVar18 + 1) {
      pVVar9 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (pRVar17,iVar18);
      sVar11 = WireFormatLite::BytesSize(pVVar9);
      sVar16 = sVar16 + sVar11;
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar10 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_UINT32:
    uVar14 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<unsigned_int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      puVar5 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,iVar18)
      ;
      iVar3 = 0x1f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar16 = sVar16 + (iVar3 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_ENUM:
    uVar14 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
      lVar13 = 0x3f;
      if (((long)*piVar8 | 1U) != 0) {
        for (; ((long)*piVar8 | 1U) >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar16 = sVar16 + ((int)lVar13 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_SFIXED32:
    lVar13 = sVar16 + 4;
    uVar14 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    goto LAB_001347ef;
  case TYPE_SFIXED64:
    lVar13 = sVar16 + 8;
    uVar14 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
LAB_001347ef:
    sVar16 = lVar13 * (ulong)uVar14;
    break;
  case TYPE_SINT32:
    uVar14 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
      sVar11 = WireFormatLite::SInt32Size(*piVar8);
      sVar16 = sVar16 + sVar11;
    }
    break;
  case MAX_FIELD_TYPE:
    uVar14 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
    sVar16 = sVar16 * uVar14;
    for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      plVar4 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
      sVar11 = WireFormatLite::SInt64Size(*plVar4);
      sVar16 = sVar16 + sVar11;
    }
    break;
  default:
    goto switchD_00134278_default;
  }
  return sVar16;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  our_size += WireFormatLite::LengthDelimitedSize(
      is_lazy ? ptr.lazymessage_value->ByteSizeLong()
              : ptr.message_value->ByteSizeLong());

  return our_size;
}